

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# LinearConstraint.cpp
# Opt level: O1

bool __thiscall
iDynTree::optimalcontrol::LinearConstraint::evaluateConstraint
          (LinearConstraint *this,double time,VectorDynSize *state,VectorDynSize *control,
          VectorDynSize *constraint)

{
  double *pdVar1;
  double *pdVar2;
  double *pdVar3;
  char *pcVar4;
  double dVar5;
  double dVar6;
  Index size_2;
  ostream *poVar7;
  string *psVar8;
  long lVar9;
  long lVar10;
  ulong uVar11;
  ulong uVar12;
  ulong uVar13;
  long lVar14;
  ulong uVar15;
  Index size_1;
  Index size;
  bool isValid;
  ostringstream errorMsg;
  long *local_1f0;
  long local_1e0 [7];
  ostringstream local_1a8 [112];
  ios_base local_138 [264];
  
  if (this->m_pimpl->constrainsState == true) {
    (*((this->m_pimpl->stateConstraintMatrix).
       super___shared_ptr<iDynTree::optimalcontrol::TimeVaryingObject<iDynTree::MatrixDynSize>,_(__gnu_cxx::_Lock_policy)2>
      ._M_ptr)->_vptr_TimeVaryingObject[2])();
    std::__cxx11::ostringstream::ostringstream(local_1a8);
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)local_1a8,"Unable to retrieve a valid state constraint matrix at time: ",
               0x3c);
    poVar7 = std::ostream::_M_insert<double>(time);
    std::__ostream_insert<char,std::char_traits<char>>(poVar7,".",1);
    psVar8 = Constraint::name_abi_cxx11_(&this->super_Constraint);
    pcVar4 = (psVar8->_M_dataplus)._M_p;
    std::__cxx11::stringbuf::str();
    iDynTree::reportError(pcVar4,"evaluateConstraint",(char *)local_1f0);
    if (local_1f0 != local_1e0) {
      operator_delete(local_1f0,local_1e0[0] + 1);
    }
    std::__cxx11::ostringstream::~ostringstream(local_1a8);
    std::ios_base::~ios_base(local_138);
  }
  else {
    if (this->m_pimpl->constrainsControl != true) {
      Constraint::constraintSize(&this->super_Constraint);
      iDynTree::VectorDynSize::resize((ulong)constraint);
      lVar9 = iDynTree::VectorDynSize::data();
      iDynTree::VectorDynSize::size();
      lVar10 = iDynTree::VectorDynSize::data();
      iDynTree::VectorDynSize::size();
      uVar11 = iDynTree::VectorDynSize::data();
      uVar12 = iDynTree::VectorDynSize::size();
      uVar13 = uVar12;
      if (((uVar11 & 7) == 0) &&
         (uVar13 = (ulong)((uint)(uVar11 >> 3) & 1), (long)uVar12 <= (long)uVar13)) {
        uVar13 = uVar12;
      }
      lVar14 = uVar12 - uVar13;
      if (0 < (long)uVar13) {
        uVar15 = 0;
        do {
          *(double *)(uVar11 + uVar15 * 8) =
               *(double *)(lVar9 + uVar15 * 8) + *(double *)(lVar10 + uVar15 * 8);
          uVar15 = uVar15 + 1;
        } while (uVar13 != uVar15);
      }
      uVar15 = (lVar14 - (lVar14 >> 0x3f) & 0xfffffffffffffffeU) + uVar13;
      if (1 < lVar14) {
        do {
          pdVar1 = (double *)(lVar9 + uVar13 * 8);
          dVar5 = pdVar1[1];
          pdVar2 = (double *)(lVar10 + uVar13 * 8);
          dVar6 = pdVar2[1];
          pdVar3 = (double *)(uVar11 + uVar13 * 8);
          *pdVar3 = *pdVar2 + *pdVar1;
          pdVar3[1] = dVar6 + dVar5;
          uVar13 = uVar13 + 2;
        } while ((long)uVar13 < (long)uVar15);
      }
      if ((long)uVar12 <= (long)uVar15) {
        return true;
      }
      do {
        *(double *)(uVar11 + uVar15 * 8) =
             *(double *)(lVar9 + uVar15 * 8) + *(double *)(lVar10 + uVar15 * 8);
        uVar15 = uVar15 + 1;
      } while (uVar12 != uVar15);
      return true;
    }
    (*((this->m_pimpl->controlConstraintMatrix).
       super___shared_ptr<iDynTree::optimalcontrol::TimeVaryingObject<iDynTree::MatrixDynSize>,_(__gnu_cxx::_Lock_policy)2>
      ._M_ptr)->_vptr_TimeVaryingObject[2])();
    std::__cxx11::ostringstream::ostringstream(local_1a8);
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)local_1a8,"Unable to retrieve a valid control constraint matrix at time: "
               ,0x3e);
    poVar7 = std::ostream::_M_insert<double>(time);
    std::__ostream_insert<char,std::char_traits<char>>(poVar7,".",1);
    psVar8 = Constraint::name_abi_cxx11_(&this->super_Constraint);
    pcVar4 = (psVar8->_M_dataplus)._M_p;
    std::__cxx11::stringbuf::str();
    iDynTree::reportError(pcVar4,"evaluateConstraint",(char *)local_1f0);
    if (local_1f0 != local_1e0) {
      operator_delete(local_1f0,local_1e0[0] + 1);
    }
    std::__cxx11::ostringstream::~ostringstream(local_1a8);
    std::ios_base::~ios_base(local_138);
  }
  return false;
}

Assistant:

bool LinearConstraint::evaluateConstraint(double time,
                                                  const VectorDynSize& state,
                                                  const VectorDynSize& control,
                                                  VectorDynSize& constraint)
        {
            if (m_pimpl->constrainsState) {
                bool isValid = false;
                const MatrixDynSize& stateConstraintMatrix = m_pimpl->stateConstraintMatrix->get(time, isValid);

                if (!isValid) {
                    std::ostringstream errorMsg;
                    errorMsg << "Unable to retrieve a valid state constraint matrix at time: " << time << ".";
                    reportError(name().c_str(), "evaluateConstraint", errorMsg.str().c_str());
                    return false;
                }

                if ((stateConstraintMatrix.cols() != state.size()) || (stateConstraintMatrix.rows() != constraintSize())) {
                    std::ostringstream errorMsg;
                    errorMsg << "The state constraint matrix at time: " << time << " has dimensions not matching with the specified state space dimension or constraint dimension.";
                    reportError(name().c_str(), "evaluateConstraint", errorMsg.str().c_str());
                }
                iDynTree::iDynTreeEigenConstMatrixMap stateConstraint = iDynTree::toEigen(stateConstraintMatrix);

                iDynTree::toEigen(m_pimpl->stateConstraintsBuffer) = stateConstraint * iDynTree::toEigen(state);
            }


            if (m_pimpl->constrainsControl) {
                bool isValid = false;
                const MatrixDynSize& controlConstraintMatrix = m_pimpl->controlConstraintMatrix->get(time, isValid);

                if (!isValid) {
                    std::ostringstream errorMsg;
                    errorMsg << "Unable to retrieve a valid control constraint matrix at time: " << time << ".";
                    reportError(name().c_str(), "evaluateConstraint", errorMsg.str().c_str());
                    return false;
                }

                if ((controlConstraintMatrix.cols() != control.size()) || (controlConstraintMatrix.rows() != constraintSize())) {
                    std::ostringstream errorMsg;
                    errorMsg << "The control constraint matrix at time: " << time << " has dimensions not matching with the specified control space dimension or constraint dimension.";
                    reportError(name().c_str(), "evaluateConstraint", errorMsg.str().c_str());
                }

                iDynTree::iDynTreeEigenConstMatrixMap controlConstraint = iDynTree::toEigen(controlConstraintMatrix);
                iDynTree::toEigen(m_pimpl->controlConstraintsBuffer) = controlConstraint * iDynTree::toEigen(control);
            }

            constraint.resize(static_cast<unsigned int>(constraintSize()));
            toEigen(constraint) = iDynTree::toEigen(m_pimpl->stateConstraintsBuffer) + iDynTree::toEigen(m_pimpl->controlConstraintsBuffer); //the buffers are zero if not constrained

            return true;

        }